

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O0

Room * __thiscall Maze::RoomNo(Maze *this,int n)

{
  bool bVar1;
  int iVar2;
  reference ppRVar3;
  __normal_iterator<Room_**,_std::vector<Room_*,_std::allocator<Room_*>_>_> local_38;
  __normal_iterator<Room_**,_std::vector<Room_*,_std::allocator<Room_*>_>_> local_30;
  __normal_iterator<Room_*const_*,_std::vector<Room_*,_std::allocator<Room_*>_>_> local_28;
  const_iterator it;
  int n_local;
  Maze *this_local;
  
  it._M_current._4_4_ = n;
  local_30._M_current = (Room **)std::vector<Room_*,_std::allocator<Room_*>_>::begin(this->mRoomVec)
  ;
  __gnu_cxx::__normal_iterator<Room*const*,std::vector<Room*,std::allocator<Room*>>>::
  __normal_iterator<Room**>
            ((__normal_iterator<Room*const*,std::vector<Room*,std::allocator<Room*>>> *)&local_28,
             &local_30);
  while( true ) {
    local_38._M_current = (Room **)std::vector<Room_*,_std::allocator<Room_*>_>::end(this->mRoomVec)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) {
      return (Room *)0x0;
    }
    ppRVar3 = __gnu_cxx::
              __normal_iterator<Room_*const_*,_std::vector<Room_*,_std::allocator<Room_*>_>_>::
              operator*(&local_28);
    iVar2 = Room::GetRoomNumber(*ppRVar3);
    if (iVar2 == it._M_current._4_4_) break;
    __gnu_cxx::__normal_iterator<Room_*const_*,_std::vector<Room_*,_std::allocator<Room_*>_>_>::
    operator++(&local_28);
  }
  ppRVar3 = __gnu_cxx::
            __normal_iterator<Room_*const_*,_std::vector<Room_*,_std::allocator<Room_*>_>_>::
            operator*(&local_28);
  return *ppRVar3;
}

Assistant:

Room* Maze::RoomNo(int n) const  
{  
    std::vector<Room*>::const_iterator it = mRoomVec->begin();  
    for ( ; it != mRoomVec->end(); ++it)  
    {  
        if ( (*it)->GetRoomNumber() == n )
        {  
            return (*it);  
            break;  
        }  
    }  
    return 0;  
}